

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::Stream::skip(Stream *this)

{
  Document *this_00;
  document_iterator i;
  document_iterator local_10;
  
  local_10 = begin(this);
  if (local_10.Doc !=
      (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0) {
    do {
      this_00 = ((local_10.Doc)->_M_t).
                super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                ._M_t.
                super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl;
      if (this_00 == (Document *)0x0) {
        return;
      }
      Document::skip(this_00);
      document_iterator::operator++(&local_10);
    } while (local_10.Doc !=
             (unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *)0x0);
  }
  return;
}

Assistant:

void Stream::skip() {
  for (document_iterator i = begin(), e = end(); i != e; ++i)
    i->skip();
}